

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

void __thiscall QHostAddress::QHostAddress(QHostAddress *this)

{
  QHostAddressPrivate *this_00;
  QHostAddressPrivate *in_RDI;
  
  this_00 = (QHostAddressPrivate *)operator_new(0x38);
  QHostAddressPrivate::QHostAddressPrivate(this_00);
  QExplicitlySharedDataPointer<QHostAddressPrivate>::QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)this_00,in_RDI);
  return;
}

Assistant:

QHostAddress::QHostAddress()
    : d(new QHostAddressPrivate)
{
}